

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O3

void anon_unknown.dwarf_20d55af::Dropout
               (TX_SIZE tx_size,TX_TYPE tx_type,int dropout_num_before,int dropout_num_after,
               tran_low_t *qcoeff_scan)

{
  long lVar1;
  uint uVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  long lVar7;
  ulong uVar8;
  unsigned_short uVar9;
  ushort uVar10;
  int *rhs;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  ulong uVar11;
  SEARCH_METHODS *pSVar12;
  ulong uVar13;
  uint8_t txb_entropy_ctx [1];
  uint16_t eobs [1];
  tran_low_t qcoeff [4096];
  tran_low_t dqcoeff [4096];
  MACROBLOCK mb;
  Message aMStack_2d720 [2];
  AssertHelper AStack_2d710;
  undefined4 uStack_2d708;
  uint uStack_2d704;
  internal aiStack_2d700 [8];
  undefined8 *puStack_2d6f8;
  int iStack_2d6f0;
  unsigned_short uStack_2d6ec;
  unsigned_short uStack_2d6ea;
  int aiStack_2d6e8 [4096];
  int aiStack_296e8 [4096];
  MACROBLOCK MStack_256e8;
  
  lVar7 = CONCAT44(in_register_00000014,dropout_num_before);
  uVar8 = (ulong)tx_size;
  uVar4 = (uint)tx_size;
  iStack_2d6f0 = (int)CONCAT71(in_register_00000039,tx_size);
  if (iStack_2d6f0 == 4) {
    uVar11 = 0x400;
    uVar6 = 4;
LAB_00718de7:
    lVar1 = *(long *)((long)&av1_scan_orders[0][0].scan + (ulong)(uint)((int)uVar6 << 8));
    uVar13 = 0;
    do {
      aiStack_2d6e8[*(short *)(lVar1 + uVar13 * 2)] = *(int *)(lVar7 + uVar13 * 4);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
    if (tx_size != '\x04') {
      uVar11 = (ulong)(uint)tx_size_2d[uVar6];
      goto LAB_00718e2c;
    }
    uVar11 = 0x400;
LAB_00718e31:
    uVar6 = 0;
    do {
      aiStack_296e8[uVar6] = aiStack_2d6e8[uVar6] * 10;
      uVar6 = uVar6 + 1;
    } while (uVar11 != uVar6);
    uStack_2d708 = (undefined4)CONCAT71((int7)(uVar11 >> 8),1);
  }
  else {
    uVar11 = (ulong)(uint)tx_size_2d[uVar8];
    uVar6 = uVar8;
    if (tx_size != '\x13') goto LAB_00718de7;
LAB_00718e2c:
    if (0 < (int)uVar11) goto LAB_00718e31;
    uStack_2d708 = 0;
  }
  uVar10 = (ushort)uVar11;
  uStack_2d704 = (uint)uVar11;
  while (uVar10 != 0) {
    uVar9 = (unsigned_short)uVar11;
    if (*(int *)(lVar7 + (ulong)(((uint)uVar11 & 0xffff) - 1) * 4) != 0) goto LAB_00718e90;
    uVar10 = uVar9 - 1;
    uVar11 = (ulong)uVar10;
  }
  uVar9 = 0;
LAB_00718e90:
  memset(&MStack_256e8,0,0x256b0);
  rhs = aiStack_296e8;
  uStack_2d6ea = uVar9;
  av1_dropout_qcoeff_num
            (&MStack_256e8,0,0,tx_size,'\0',4,(int)CONCAT71(in_register_00000031,tx_type));
  uVar2 = uStack_2d704;
  if ((char)iStack_2d6f0 == '\x04') {
    uVar5 = 0x400;
    uVar4 = 4;
  }
  else {
    if ((char)iStack_2d6f0 == '\x13') goto LAB_00718f40;
    uVar5 = tx_size_2d[uVar8];
  }
  lVar1 = *(long *)((long)&av1_scan_orders[0][0].scan + (ulong)(uVar4 << 8));
  uVar8 = 0;
  do {
    *(int *)(lVar7 + uVar8 * 4) = aiStack_2d6e8[*(short *)(lVar1 + uVar8 * 2)];
    uVar8 = uVar8 + 1;
  } while (uVar5 != uVar8);
LAB_00718f40:
  uVar10 = (ushort)uStack_2d704;
  uVar4 = uStack_2d704;
  while (uVar10 != 0) {
    uStack_2d6ec = (unsigned_short)uVar4;
    if (*(int *)(lVar7 + (ulong)((uVar4 & 0xffff) - 1) * 4) != 0) goto LAB_00718f5b;
    uVar10 = uStack_2d6ec - 1;
    uVar4 = (uint)uVar10;
  }
  uStack_2d6ec = 0;
LAB_00718f5b:
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            (aiStack_2d700,"new_eob","mb.plane[kPlane].eobs[0]",&uStack_2d6ec,&uStack_2d6ea);
  if (aiStack_2d700[0] == (internal)0x0) {
    testing::Message::Message(aMStack_2d720);
    if (puStack_2d6f8 == (undefined8 *)0x0) {
      pSVar12 = "";
    }
    else {
      pSVar12 = (SEARCH_METHODS *)*puStack_2d6f8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_2d710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodemb_test.cc"
               ,0x53,(char *)pSVar12);
    testing::internal::AssertHelper::operator=(&AStack_2d710,aMStack_2d720);
    testing::internal::AssertHelper::~AssertHelper(&AStack_2d710);
    if ((long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)aMStack_2d720[0].ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)aMStack_2d720[0].ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  puVar3 = puStack_2d6f8;
  if (puStack_2d6f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_2d6f8 != puStack_2d6f8 + 2) {
      operator_delete((undefined8 *)*puStack_2d6f8);
    }
    operator_delete(puVar3);
  }
  if ((char)uStack_2d708 != '\0') {
    uVar8 = 0;
    do {
      aMStack_2d720[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = aiStack_2d6e8[uVar8] * 10;
      testing::internal::CmpHelperEQ<int,int>
                (aiStack_2d700,"qcoeff[i] * kDequantFactor","dqcoeff[i]",(int *)aMStack_2d720,rhs);
      if (aiStack_2d700[0] == (internal)0x0) {
        testing::Message::Message(aMStack_2d720);
        pSVar12 = "";
        if (puStack_2d6f8 != (undefined8 *)0x0) {
          pSVar12 = (SEARCH_METHODS *)*puStack_2d6f8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_2d710,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodemb_test.cc"
                   ,0x57,(char *)pSVar12);
        testing::internal::AssertHelper::operator=(&AStack_2d710,aMStack_2d720);
        testing::internal::AssertHelper::~AssertHelper(&AStack_2d710);
        if ((long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)aMStack_2d720[0].ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (int)aMStack_2d720[0].ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
        }
      }
      puVar3 = puStack_2d6f8;
      if (puStack_2d6f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_2d6f8 != puStack_2d6f8 + 2) {
          operator_delete((undefined8 *)*puStack_2d6f8);
        }
        operator_delete(puVar3);
      }
      uVar8 = uVar8 + 1;
      rhs = rhs + 1;
    } while (uVar2 != uVar8);
  }
  return;
}

Assistant:

void Dropout(TX_SIZE tx_size, TX_TYPE tx_type, int dropout_num_before,
             int dropout_num_after, tran_low_t *qcoeff_scan) {
  tran_low_t qcoeff[MAX_TX_SQUARE];
  // qcoeff_scan is assumed to be in scan order, since tests are easier to
  // understand this way, but av1_dropout_qcoeff expects coeffs in lexico order
  // so we convert to lexico then back to scan afterwards.
  ToLexicoOrder(tx_size, tx_type, qcoeff_scan, qcoeff);

  const int max_eob = av1_get_max_eob(tx_size);
  const int kDequantFactor = 10;
  tran_low_t dqcoeff[MAX_TX_SQUARE];
  for (int i = 0; i < max_eob; ++i) {
    dqcoeff[i] = qcoeff[i] * kDequantFactor;
  }

  uint16_t eob = max_eob;
  while (eob > 0 && qcoeff_scan[eob - 1] == 0) --eob;

  MACROBLOCK mb;
  const int kPlane = 0;
  const int kBlock = 0;
  memset(&mb, 0, sizeof(mb));
  uint16_t eobs[] = { eob };
  mb.plane[kPlane].eobs = eobs;
  mb.plane[kPlane].qcoeff = qcoeff;
  mb.plane[kPlane].dqcoeff = dqcoeff;
  uint8_t txb_entropy_ctx[1];
  mb.plane[kPlane].txb_entropy_ctx = txb_entropy_ctx;

  av1_dropout_qcoeff_num(&mb, kPlane, kBlock, tx_size, tx_type,
                         dropout_num_before, dropout_num_after);

  ToScanOrder(tx_size, tx_type, qcoeff, qcoeff_scan);

  // Check updated eob value is valid.
  uint16_t new_eob = max_eob;
  while (new_eob > 0 && qcoeff_scan[new_eob - 1] == 0) --new_eob;
  EXPECT_EQ(new_eob, mb.plane[kPlane].eobs[0]);

  // Check dqcoeff is still valid.
  for (int i = 0; i < max_eob; ++i) {
    EXPECT_EQ(qcoeff[i] * kDequantFactor, dqcoeff[i]);
  }
}